

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_os_socket_socket(int domain,int type,int protocol)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int e;
  int s;
  int flags;
  int local_4;
  
  local_4 = socket(in_EDI,in_ESI,in_EDX);
  if ((-1 < local_4) &&
     ((uVar1 = fcntl(local_4,1), uVar1 == 0xffffffff ||
      (iVar2 = fcntl(local_4,2,(long)(int)(uVar1 | 1)), iVar2 == -1)))) {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    close(local_4);
    piVar3 = __errno_location();
    *piVar3 = iVar2;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
amqp_os_socket_socket(int domain, int type, int protocol)
{
#ifdef _WIN32
    /*
      This cast is to squash warnings on Win64, see:
      http://stackoverflow.com/questions/1953639/is-it-safe-to-cast-socket-to-int-under-win64
    */
  return (int)socket(domain, type, protocol);
#else
  int flags;

  int s = socket(domain, type, protocol);
  if (s < 0) {
    return s;
  }

  /* Always enable CLOEXEC on the socket */
  flags = fcntl(s, F_GETFD);
  if (flags == -1
      || fcntl(s, F_SETFD, (long)(flags | FD_CLOEXEC)) == -1) {
    int e = errno;
    close(s);
    errno = e;
    return -1;
  }

  return s;

#endif
}